

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int local_28;
  int local_24;
  int ypos;
  int xpos;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    ypos = mods;
    xpos = action;
    mods_local = scancode;
    action_local = key;
    _scancode_local = window;
    if (key == 0x20) {
      glfwGetWindowPos(window,&local_24,&local_28);
      glfwSetWindowPos(_scancode_local,local_24,local_28);
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_SPACE:
        {
            int xpos, ypos;
            glfwGetWindowPos(window, &xpos, &ypos);
            glfwSetWindowPos(window, xpos, ypos);
            break;
        }

        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;
    }
}